

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-memchunk.c
# Opt level: O3

void test_alloc_small(void)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  MEMCHUNK chunk;
  MEMCHUNK local_48;
  
  local_48.free_off = 0;
  local_48.head = (MEMCHUNK_BLOCK *)0x0;
  local_48.block_size = 0x400;
  uVar5 = 0;
  plVar6 = (long *)0x0;
  do {
    plVar2 = (long *)memchunk_alloc(&local_48,0xc);
    iVar1 = acutest_check_((uint)(plVar2 != (long *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-memchunk.c"
                           ,0x2b,"%s","ptr != NULL");
    if (iVar1 == 0) {
      acutest_abort_();
    }
    if (plVar6 != (long *)0x0) {
      acutest_check_((uint)((long)plVar2 - (long)plVar6 == 0xc),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-memchunk.c"
                     ,0x2d,"%s","(uintptr_t) ptr - (uintptr_t) prev_ptr == 12");
    }
    lVar3 = (uVar5 & 0xff) * 0x101010101010101;
    *plVar2 = lVar3;
    *(int *)(plVar2 + 1) = (int)lVar3;
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
    plVar6 = plVar2;
  } while (uVar4 != 10);
  memchunk_fini(&local_48);
  return;
}

Assistant:

static void
test_alloc_small(void)
{
    MEMCHUNK chunk = MEMCHUNK_INITIALIZER(0);
    void* prev_ptr = NULL;
    void* ptr;
    int i;

    for(i = 0; i < 10; i++) {
        ptr = memchunk_alloc(&chunk, 12);
        TEST_ASSERT(ptr != NULL);
        if(prev_ptr != NULL)
            TEST_CHECK((uintptr_t) ptr - (uintptr_t) prev_ptr == 12);
        memset(ptr, i, 12);
        prev_ptr = ptr;
    }

    memchunk_fini(&chunk);
}